

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O0

void ymf278b_pcm_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  INT8 oct;
  int iVar1;
  UINT32 UVar2;
  UINT32 UVar3;
  int iVar4;
  INT16 IVar5;
  UINT16 UVar6;
  INT16 IVar7;
  int iVar8;
  int iVar9;
  YMF278BSlot *slot;
  UINT32 local_74;
  UINT32 step;
  INT32 volRight;
  INT32 volLeft;
  UINT16 envVol;
  INT32 smplOut;
  INT16 sample;
  YMF278BSlot *sl;
  INT32 vr;
  INT32 vl;
  UINT32 j;
  int i;
  YMF278BChip *chip;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *info_local;
  
  memset(*outputs,0,(ulong)samples << 2);
  memset(outputs[1],0,(ulong)samples << 2);
  iVar8 = ymf278b_anyActive((YMF278BChip *)info);
  if (iVar8 != 0) {
    iVar8 = mix_level[*(int *)((long)info + 0x518)];
    iVar1 = mix_level[*(int *)((long)info + 0x51c)];
    for (vr = 0; (uint)vr < samples; vr = vr + 1) {
      for (vl = 0; vl < 0x18; vl = vl + 1) {
        slot = (YMF278BSlot *)((long)info + (long)vl * 0x34 + 0x20);
        if ((slot->state != '\0') && (slot->Muted == '\0')) {
          IVar5 = ymf278b_getSample((YMF278BChip *)info,slot,slot->pos);
          UVar2 = slot->stepptr;
          UVar6 = ymf278b_nextPos(slot,slot->pos,1);
          IVar7 = ymf278b_getSample((YMF278BChip *)info,slot,UVar6);
          UVar3 = slot->stepptr;
          volRight._2_2_ = slot->env_vol;
          if ((slot->lfo_active != '\0') && (slot->AM != '\0')) {
            UVar6 = ymf278b_slot_compute_am(slot);
            volRight._2_2_ = volRight._2_2_ + UVar6;
          }
          if (0x27f < volRight._2_2_) {
            volRight._2_2_ = 0x280;
          }
          iVar4 = pan_right[slot->pan];
          iVar9 = (((int)(short)((int)IVar5 * (0x10000 - UVar2) + (int)IVar7 * UVar3 >> 0x10) *
                    vol_tab[volRight._2_2_] >> 0xf) * vol_tab[(int)((uint)slot->TL << 2)] >> 0xf) *
                  0x5a82 >> 0x11;
          (*outputs)[(uint)vr] =
               (iVar9 * ((int)(0x20 - (pan_left[slot->pan] + iVar8 & 0xfU)) >>
                        ((byte)(pan_left[slot->pan] + iVar8 >> 4) & 0x1f)) >> 5) +
               (*outputs)[(uint)vr];
          outputs[1][(uint)vr] =
               (iVar9 * ((int)(0x20 - (iVar4 + iVar1 & 0xfU)) >> ((byte)(iVar4 + iVar1 >> 4) & 0x1f)
                        ) >> 5) + outputs[1][(uint)vr];
          if ((slot->lfo_active == '\0') || (slot->vib == '\0')) {
            local_74 = slot->step;
          }
          else {
            oct = slot->OCT;
            UVar6 = slot->FN;
            IVar5 = ymf278b_slot_compute_vib(slot);
            local_74 = calcStep(oct,UVar6,IVar5);
          }
          slot->stepptr = local_74 + slot->stepptr;
          if (0xffff < slot->stepptr) {
            UVar6 = ymf278b_nextPos(slot,slot->pos,(UINT16)(slot->stepptr >> 0x10));
            slot->pos = UVar6;
            slot->stepptr = slot->stepptr & 0xffff;
          }
        }
      }
      ymf278b_advance((YMF278BChip *)info);
    }
  }
  return;
}

Assistant:

static void ymf278b_pcm_update(void *info, UINT32 samples, DEV_SMPL** outputs)
{
	YMF278BChip* chip = (YMF278BChip *)info;
	int i;
	UINT32 j;
	INT32 vl;
	INT32 vr;
	
	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	
	if (! ymf278b_anyActive(chip))
	{
		// TODO update internal state, even if muted
		// TODO also mute individual channels
		return;
	}

	vl = mix_level[chip->pcm_l];
	vr = mix_level[chip->pcm_r];
	for (j = 0; j < samples; j ++)
	{
		for (i = 0; i < 24; i ++)
		{
			YMF278BSlot* sl;
			INT16 sample;
			INT32 smplOut;
			UINT16 envVol;
			INT32 volLeft;
			INT32 volRight;
			UINT32 step;
			
			sl = &chip->slots[i];
			if (sl->state == EG_OFF || sl->Muted)
			{
				//outputs[0][j] += 0;
				//outputs[1][j] += 0;
				continue;
			}

			sample = (ymf278b_getSample(chip, sl, sl->pos) * (0x10000 - sl->stepptr) +
			          ymf278b_getSample(chip, sl, ymf278b_nextPos(sl, sl->pos, 1)) * sl->stepptr) >> 16;
			
			// TL levels are 00..FF internally (TL register value 7F is mapped to TL level FF)
			// Envelope levels have 4x the resolution (000..3FF)
			// Volume levels are approximate logarithmic: -6 db result in half volume. Steps in between use linear interpolation.
			// A volume of -60 db or lower results in silence. (value 0x280..0x3FF).
			// Recordings from actual hardware indicate, that TL level and envelope level are applied separately.
			// Each of them is clipped to silence below -60 db, but TL+envelope might result in a lower volume. -Valley Bell
			envVol = (UINT16)sl->env_vol;
			if (sl->lfo_active && sl->AM)
				envVol += ymf278b_slot_compute_am(sl);
			if (envVol >= MAX_ATT_INDEX)
				envVol = MAX_ATT_INDEX;
			smplOut = (sample * vol_tab[envVol]) >> 15;
			smplOut = (smplOut * vol_tab[sl->TL << TL_SHIFT]) >> 15;

			// Panning is also done separately. (low-volume TL + low-volume panning goes below -60 db)
			// I'll be taking wild guess and assume that -3 db is approximated with 75%. (same as with TL and envelope levels)
			// The same applies to the PCM mix level.
			volLeft  = pan_left [sl->pan] + vl;
			volRight = pan_right[sl->pan] + vr;
			// 0 -> 0x20, 8 -> 0x18, 16 -> 0x10, 24 -> 0x0C, etc. (not using vol_tab here saves array boundary checks)
			volLeft  = (0x20 - (volLeft  & 0x0F)) >> (volLeft  >> 4);
			volRight = (0x20 - (volRight & 0x0F)) >> (volRight >> 4);
			
			smplOut = (smplOut * 0x5A82) >> 17;	// reduce volume by -15 db, should bring it into balance with FM
			outputs[0][j] += (smplOut * volLeft ) >> 5;
			outputs[1][j] += (smplOut * volRight) >> 5;

			step = (sl->lfo_active && sl->vib)
			     ? calcStep(sl->OCT, sl->FN, ymf278b_slot_compute_vib(sl))
			     : sl->step;
			sl->stepptr += step;

			if (sl->stepptr >= 0x10000)
			{
				sl->pos = ymf278b_nextPos(sl, sl->pos, sl->stepptr >> 16);
				sl->stepptr &= 0xFFFF;
			}
		}
		ymf278b_advance(chip);
	}
}